

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O2

float __thiscall
o3dgc::BinaryStream::ReadFloat32
          (BinaryStream *this,unsigned_long *position,O3DGCStreamType streamType)

{
  float fVar1;
  unsigned_long uVar2;
  
  if (streamType == O3DGC_STREAM_TYPE_ASCII) {
    uVar2 = ReadUInt32ASCII(this,position);
    fVar1 = (float)uVar2;
  }
  else {
    uVar2 = ReadUInt32Bin(this,position);
    fVar1 = (float)uVar2;
  }
  return fVar1;
}

Assistant:

float                   ReadFloat32(unsigned long & position, O3DGCStreamType streamType) const
                                {
                                    float value;
                                    if (streamType == O3DGC_STREAM_TYPE_ASCII)
                                    {
                                        value = ReadFloat32ASCII(position);
                                    }
                                    else
                                    {
                                        value = ReadFloat32Bin(position);
                                    }
                                    return value;
                                }